

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDSketch.cpp
# Opt level: O2

void LDSketch_write_plaintext(LDSketch_t *sk,char *outfile)

{
  longlong lVar1;
  uint uVar2;
  FILE *__stream;
  int iVar3;
  int iVar4;
  uint64_t key_int;
  
  __stream = fopen(outfile,"w");
  if (__stream != (FILE *)0x0) {
    fprintf(__stream,"Worker: %u, length of key: %d\n",(ulong)sk->tbl_id,(ulong)(uint)sk->lgn);
    fprintf(__stream,"# of hash row: %d\n",(ulong)(uint)sk->h);
    fprintf(__stream,"# of buckets: %d\n",(ulong)(uint)sk->w);
    key_int = 0x102030405060708;
    for (iVar3 = 0; iVar3 < sk->h; iVar3 = iVar3 + 1) {
      uVar2 = LDSketch_find(sk,(uchar *)&key_int,0,sk->lgn + -1,iVar3);
      fprintf(__stream,"%u ",(ulong)uVar2);
    }
    fputc(10,__stream);
    for (iVar3 = 0; iVar3 < sk->h; iVar3 = iVar3 + 1) {
      for (iVar4 = 0; iVar4 < sk->w; iVar4 = iVar4 + 1) {
        lVar1 = sk->tbl[(uint)(sk->w * iVar3 + iVar4)]->total;
        uVar2 = dyn_tbl_length(sk->tbl[(uint)(sk->w * iVar3 + iVar4)]);
        fprintf(__stream,"%lld %d, ",lVar1,(ulong)uVar2);
      }
      fputc(10,__stream);
    }
    fclose(__stream);
    return;
  }
  fprintf(_stderr,"ERR: cannot open %s\n",outfile);
  exit(-1);
}

Assistant:

void LDSketch_write_plaintext(LDSketch_t* sk, const char* outfile) {
	FILE* fp;
	int i, j;

	// open a file
	if ((fp = fopen(outfile, "w")) == NULL) {
		fprintf(stderr, "ERR: cannot open %s\n", outfile);
		exit(-1);
	}

	// write to a file (including n and bd???)
	fprintf(fp, "Worker: %u, length of key: %d\n", sk->tbl_id, sk->lgn);
	fprintf(fp, "# of hash row: %d\n", sk->h);
	fprintf(fp, "# of buckets: %d\n", sk->w);

	uint64_t key_int = 0x0102030405060708;
	unsigned char* key = (unsigned char*)&key_int;
	for (i = 0; i < sk->h; ++i) {
		unsigned int k = LDSketch_find(sk, key, 0, sk->lgn - 1, i);
		fprintf(fp, "%u ", k);
	}
	fprintf(fp, "\n");

	for (i = 0; i < sk->h; ++i) {
		for (j = 0; j < sk->w; ++j) {
			// fprintf(fp, "%lld ", tbl->T[tbl->w*i + j]);
			unsigned int index = sk->w * i + j;
			fprintf(fp, "%lld %d, ", sk->tbl[index]->total,
				dyn_tbl_length(sk->tbl[index]));
		}
		fprintf(fp, "\n");
	}

	// close the file
	fclose(fp);
}